

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

void __thiscall Mems::save_mirrors_with_samples_2(Mems *this,string *input)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pPVar3;
  string local_248 [8];
  fstream f;
  ostream local_238 [512];
  Mems *local_38;
  
  std::fstream::fstream(local_248);
  std::fstream::open(local_248,(_Ios_Openmode)input);
  local_38 = this;
  for (pMVar2 = (this->_mems_mirrors_randomrasterized).
                super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pMVar2 != (local_38->_mems_mirrors_randomrasterized).
                super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.super__Vector_impl_data.
                _M_finish; pMVar2 = pMVar2 + 1) {
    poVar1 = std::operator<<(local_238,"id ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pMVar2->id);
    std::operator<<(poVar1,";\n");
    std::operator<<(local_238,"pos ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_position).x);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_position).y);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_position).dis);
    std::operator<<(poVar1,";\n");
    std::operator<<(local_238,"dis_sample ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).x);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).y);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>((pMVar2->_displayed_sample).dis);
    std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(local_238,"sample_ammount ");
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)poVar1,pMVar2->_ammount_of_matching_samples);
    std::operator<<(poVar1,";\n");
    for (pPVar3 = (pMVar2->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar3 != (pMVar2->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
      std::operator<<(local_238,"pos ");
      poVar1 = std::ostream::_M_insert<double>(pPVar3->x);
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>(pPVar3->y);
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>(pPVar3->dis);
      std::operator<<(poVar1,";\n");
    }
    poVar1 = std::operator<<(local_238,"--- ");
    std::operator<<(poVar1,";\n");
  }
  std::fstream::close();
  std::fstream::~fstream(local_248);
  return;
}

Assistant:

void Mems::save_mirrors_with_samples_2(std::string input){
    std::fstream f;
    f.open(input, std::ios::out);
    for(auto mi = _mems_mirrors_randomrasterized.begin(); mi!= _mems_mirrors_randomrasterized.end(); ++mi){
        f << "id " << mi->id<< ";\n";
        f << "pos " << mi->_position.x<< " "<< mi->_position.y<< " "<< mi->_position.dis<< ";\n";
        f << "dis_sample " << mi->_displayed_sample.x<< " "<< mi->_displayed_sample.y<< " "<< mi->_displayed_sample.dis<< ";\n";
        f << "sample_ammount " << mi->_ammount_of_matching_samples<< ";\n";
        for(auto sam = mi->_matching_samples.begin(); sam!=mi->_matching_samples.end(); ++sam){
          f << "pos " <<sam->x<< " "<< sam->y<< " "<< sam->dis<< ";\n";
        }
        f << "--- " << ";\n";
      }
      f.close();
    }